

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CounterUnitTest.cpp
# Opt level: O2

bool TestComparisonsF<Counter<unsigned_long,48u>>(void)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  bool bVar7;
  
  uVar1 = 0;
  while (uVar2 = uVar1, uVar2 != 3) {
    uVar3 = uVar2 ^ 0xffffffffffff;
    iVar6 = 1000;
    uVar5 = 0;
    uVar4 = uVar2 + 1;
    while (bVar7 = iVar6 != 0, iVar6 = iVar6 + -1, bVar7) {
      if ((((((uVar3 - uVar5 == 0) || (uVar3 - uVar4 == 0)) || (uVar5 - uVar4 == 0)) ||
           (((uVar3 - uVar5 & 0x800000000000) == 0 || ((uVar3 - uVar4 & 0x800000000000) == 0)))) ||
          (((uVar5 - uVar4 & 0x800000000000) == 0 ||
           (((uVar5 - uVar3 & 0x800000000000) != 0 || ((uVar4 - uVar3 & 0x800000000000) != 0))))))
         || ((uVar4 - uVar5 & 0x800000000000) != 0)) goto LAB_00101780;
      uVar3 = uVar3 + 1 & 0xffffffffffff;
      uVar5 = uVar5 + 1 & 0xffffffffffff;
      uVar4 = uVar4 + 1 & 0xffffffffffff;
    }
    iVar6 = 2000;
    while (bVar7 = iVar6 != 0, iVar6 = iVar6 + -1, uVar1 = uVar2 + 1, bVar7) {
      if (((((uVar3 - uVar5 == 0) || (uVar3 - uVar4 == 0)) || (uVar5 - uVar4 == 0)) ||
          ((((uVar3 - uVar5 & 0x800000000000) == 0 || ((uVar3 - uVar4 & 0x800000000000) == 0)) ||
           (((uVar5 - uVar4 & 0x800000000000) == 0 ||
            (((uVar5 - uVar3 & 0x800000000000) != 0 || ((uVar4 - uVar3 & 0x800000000000) != 0)))))))
          ) || ((uVar4 - uVar5 & 0x800000000000) != 0)) goto LAB_00101780;
      uVar3 = uVar3 + 0xffffffffffff & 0xffffffffffff;
      uVar5 = uVar5 + 0xffffffffffff & 0xffffffffffff;
      uVar4 = uVar4 + 0xffffffffffff & 0xffffffffffff;
    }
  }
LAB_00101780:
  return 2 < uVar2;
}

Assistant:

bool TestComparisonsF()
{
    CounterT a = 2, b = 2, c = 3;
    TEST_CHECK(a == b);
    TEST_CHECK(b != c);
    b = c;
    TEST_CHECK(b == c);
    TEST_CHECK(a != b);

    for (unsigned sep = 0; sep < 3; ++sep)
    {
        a = CounterT::kMask - sep;
        b = 0;
        c = 1 + sep;

        for (unsigned ii = 0; ii < 1000; ++ii)
        {
            TEST_CHECK(a == a);
            TEST_CHECK(b == b);
            TEST_CHECK(c == c);
            TEST_CHECK(a != b);
            TEST_CHECK(a != c);
            TEST_CHECK(b != a);
            TEST_CHECK(b != c);
            TEST_CHECK(c != a);
            TEST_CHECK(c != b);

            TEST_CHECK(a < b);
            TEST_CHECK(a < c);
            TEST_CHECK(b < c);
            TEST_CHECK(a <= b);
            TEST_CHECK(a <= c);
            TEST_CHECK(b <= c);
            TEST_CHECK(a <= a);
            TEST_CHECK(b <= b);
            TEST_CHECK(c <= c);

            TEST_CHECK(b > a);
            TEST_CHECK(c > a);
            TEST_CHECK(c > b);
            TEST_CHECK(b >= a);
            TEST_CHECK(c >= a);
            TEST_CHECK(c >= b);
            TEST_CHECK(a >= a);
            TEST_CHECK(b >= b);
            TEST_CHECK(c >= c);

            a++;
            ++b;
            c++;
        }

        for (unsigned ii = 0; ii < 2000; ++ii)
        {
            TEST_CHECK(a == a);
            TEST_CHECK(b == b);
            TEST_CHECK(c == c);
            TEST_CHECK(a != b);
            TEST_CHECK(a != c);
            TEST_CHECK(b != a);
            TEST_CHECK(b != c);
            TEST_CHECK(c != a);
            TEST_CHECK(c != b);

            TEST_CHECK(a < b);
            TEST_CHECK(a < c);
            TEST_CHECK(b < c);
            TEST_CHECK(a <= b);
            TEST_CHECK(a <= c);
            TEST_CHECK(b <= c);
            TEST_CHECK(a <= a);
            TEST_CHECK(b <= b);
            TEST_CHECK(c <= c);

            TEST_CHECK(b > a);
            TEST_CHECK(c > a);
            TEST_CHECK(c > b);
            TEST_CHECK(b >= a);
            TEST_CHECK(c >= a);
            TEST_CHECK(c >= b);
            TEST_CHECK(a >= a);
            TEST_CHECK(b >= b);
            TEST_CHECK(c >= c);

            a--;
            --b;
            c--;
        }
    }

    return true;
}